

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O2

bool __thiscall Js::AsmJsEncoder::ReadOp(AsmJsEncoder *this)

{
  ByteCodeReader *this_00;
  code *pcVar1;
  bool bVar2;
  OpCodeAsmJs op;
  uint uVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  ulong in_RAX;
  byte *pbVar6;
  byte *pbVar7;
  ByteBlock *this_01;
  undefined4 *puVar8;
  undefined8 local_38;
  LayoutSize layoutSize;
  
  this_00 = &this->mReader;
  local_38 = in_RAX;
  uVar3 = ByteCodeReader::GetCurrentOffset(this_00);
  op = ByteCodeReader::ReadOp(this_00,(LayoutSize *)((long)&local_38 + 4));
  pbVar6 = ByteCodeReader::GetIP(this_00);
  this->ip = pbVar6;
  uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
  LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->mFunctionBody);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,AsmjsEncoderPhase,uVar4,LVar5);
  if (bVar2) {
    local_38 = CONCAT44(local_38._4_4_,uVar3);
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
    LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->mFunctionBody);
    Output::Print(L"%d.%d:Encoding ",(ulong)uVar3,(ulong)LVar5);
    AsmJsByteCodeDumper::DumpOp(op,local_38._4_4_,this_00,this->mFunctionBody);
    pbVar6 = this->ip;
    pbVar7 = ByteCodeReader::GetIP(this_00);
    if (pbVar6 != pbVar7) {
      ByteCodeReader::SetIP(this_00,this->ip);
    }
    Output::Print(L"  at offset 0x%X (buffer size = 0x%X)\n",local_38 & 0xffffffff,
                  (ulong)(uint)(*(int *)&this->mPc - *(int *)&this->mEncodeBuffer));
    Output::Flush();
  }
  if (op == EndOfBlock) {
    uVar3 = ByteCodeReader::GetCurrentOffset(this_00);
    this_01 = FunctionBody::GetByteCode(this->mFunctionBody);
    uVar4 = ByteBlock::GetLength(this_01);
    if (uVar3 != uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsEncoder.cpp"
                                  ,0x89,
                                  "(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength())"
                                  ,
                                  "mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
  }
  else if (local_38._4_4_ == 2) {
    ReadOpTemplate<(Js::LayoutSize)2>(this,op);
  }
  else if (local_38._4_4_ == 1) {
    ReadOpTemplate<(Js::LayoutSize)1>(this,op);
  }
  else if (local_38._4_4_ == 0) {
    ReadOpTemplate<(Js::LayoutSize)0>(this,op);
  }
  return op != EndOfBlock;
}

Assistant:

bool AsmJsEncoder::ReadOp()
    {
#if DBG_DUMP
        int bytecodeoffset = mReader.GetCurrentOffset();
#endif
        LayoutSize layoutSize;
        OpCodeAsmJs op = (OpCodeAsmJs)mReader.ReadOp(layoutSize);
        ip = mReader.GetIP();
#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsEncoderPhase, mFunctionBody))
        {
            Output::Print(_u("%d.%d:Encoding "),
                           this->mFunctionBody->GetSourceContextId(),
                           this->mFunctionBody->GetLocalFunctionId());
            AsmJsByteCodeDumper::DumpOp( op, layoutSize, mReader, mFunctionBody );
            if( ip != mReader.GetIP() )
            {
                mReader.SetIP( ip );
            }
            Output::Print(_u("  at offset 0x%X (buffer size = 0x%X)\n"),
                           bytecodeoffset, (int)(mPc-mEncodeBuffer));
            Output::Flush();
        }
#endif
        if( op == OpCodeAsmJs::EndOfBlock )
        {
            Assert(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength());
            // last bytecode
            return false;
        }
        switch( layoutSize )
        {
        case Js::SmallLayout:
            ReadOpTemplate<Js::SmallLayout>( op );
            break;
        case Js::MediumLayout:
            ReadOpTemplate<Js::MediumLayout>( op );
            break;
        case Js::LargeLayout:
            ReadOpTemplate<Js::LargeLayout>( op );
            break;
        default:
            break;
        }
        return true;
    }